

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_wu_2009.h
# Opt level: O1

void __thiscall SAUF<UFPC>::FirstScan(SAUF<UFPC> *this)

{
  long lVar1;
  uint uVar2;
  Mat1b *pMVar3;
  Mat1i *pMVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  lVar8 = (long)*(int *)&pMVar3->field_0x8;
  uVar2 = *(uint *)&pMVar3->field_0xc;
  memset(*(void **)&pMVar4->field_0x10,0,*(long *)&pMVar4->field_0x20 - *(long *)&pMVar4->field_0x18
        );
  *UFPC::P_ = 0;
  UFPC::length_ = 1;
  if (0 < lVar8) {
    lVar10 = -1;
    lVar12 = 0;
    do {
      if (0 < (int)uVar2) {
        pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
        pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
        lVar9 = *(long *)&pMVar3->field_0x10;
        lVar5 = **(long **)&pMVar3->field_0x48;
        lVar6 = *(long *)&pMVar4->field_0x10;
        lVar13 = **(long **)&pMVar4->field_0x48;
        lVar1 = lVar6 + lVar13 * lVar12;
        lVar11 = lVar1 + -4;
        lVar6 = lVar6 + lVar13 * lVar10;
        lVar13 = lVar5 * lVar10 + lVar9;
        lVar9 = lVar5 * lVar12 + lVar9;
        uVar14 = 0;
        do {
          if (*(char *)(lVar9 + uVar14) != '\0') {
            if ((lVar12 == 0) || (*(char *)(lVar13 + uVar14) == '\0')) {
              if ((lVar12 == 0) ||
                 (((long)(int)uVar2 + -1 <= (long)uVar14 || (*(char *)(lVar13 + 1 + uVar14) == '\0')
                  ))) {
                if ((uVar14 == 0 || lVar12 == 0) || (*(char *)(lVar13 + -1 + uVar14) == '\0')) {
                  if ((uVar14 == 0) || (*(char *)(lVar9 + -1 + uVar14) == '\0')) {
                    UFPC::P_[UFPC::length_] = UFPC::length_;
                    uVar7 = UFPC::length_;
                    UFPC::length_ = UFPC::length_ + 1;
                  }
                  else {
                    uVar7 = *(uint *)(lVar11 + uVar14 * 4);
                  }
                }
                else {
                  uVar7 = *(uint *)(lVar6 + -4 + uVar14 * 4);
                }
              }
              else if (uVar14 == 0) {
LAB_001c41a6:
                uVar7 = *(uint *)(lVar6 + 4 + uVar14 * 4);
              }
              else {
                if (*(char *)(lVar13 + -1 + uVar14) == '\0') {
                  if (*(char *)(lVar9 + -1 + uVar14) == '\0') goto LAB_001c41a6;
                  uVar7 = *(uint *)(lVar11 + uVar14 * 4);
                }
                else {
                  uVar7 = *(uint *)(lVar6 + -4 + uVar14 * 4);
                }
                uVar7 = UFPC::Merge(uVar7,*(uint *)(lVar6 + 4 + uVar14 * 4));
              }
            }
            else {
              uVar7 = *(uint *)(lVar6 + uVar14 * 4);
            }
            *(uint *)(lVar1 + uVar14 * 4) = uVar7;
          }
          uVar14 = uVar14 + 1;
        } while (uVar2 != uVar14);
      }
      lVar12 = lVar12 + 1;
      lVar10 = lVar10 + 1;
    } while (lVar12 != lVar8);
  }
  return;
}

Assistant:

void FirstScan() {

        const int h = img_.rows;
        const int w = img_.cols;

        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart); // Initialization

        LabelsSolver::Setup();

        // Rosenfeld Mask
        // +-+-+-+
        // |p|q|r|
        // +-+-+-+
        // |s|x|
        // +-+-+

        // First scan
        for (int r = 0; r < h; ++r) {
            // Get row pointers
            unsigned char const * const img_row = img_.ptr<unsigned char>(r);
            unsigned char const * const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            unsigned * const  img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned * const  img_labels_row_prev = (unsigned *)(((char *)img_labels_row) - img_labels_.step.p[0]);

            for (int c = 0; c < w; ++c) {
#define CONDITION_P c > 0 && r > 0 && img_row_prev[c - 1] > 0
#define CONDITION_Q r > 0 && img_row_prev[c] > 0
#define CONDITION_R c < w - 1 && r > 0 && img_row_prev[c + 1] > 0
#define CONDITION_S c > 0 && img_row[c - 1] > 0
#define CONDITION_X img_row[c] > 0

#define ACTION_1 // nothing to do 
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); // new label
#define ACTION_3 img_labels_row[c] = img_labels_row_prev[c - 1]; // x <- p
#define ACTION_4 img_labels_row[c] = img_labels_row_prev[c]; // x <- q
#define ACTION_5 img_labels_row[c] = img_labels_row_prev[c + 1]; // x <- r
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 1]; // x <- s
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev[c - 1], img_labels_row_prev[c + 1]); // x <- p + r
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row[c - 1], img_labels_row_prev[c + 1]); // x <- s + r

#include "labeling_wu_2009_tree.inc.h"
            }
        }

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8

#undef CONDITION_P
#undef CONDITION_Q
#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_X
    }